

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frobtadsappcurses.cc
# Opt level: O2

void __thiscall
FrobTadsApplicationCurses::scrollRegionUp
          (FrobTadsApplicationCurses *this,int top,int left,int bottom,int right,int attrs)

{
  chtype ch;
  int i;
  int y;
  int x;
  
  while (y = bottom, top < y) {
    for (x = left; bottom = y + -1, x <= right; x = x + 1) {
      ch = FrobTadsWindow::charAt
                     ((this->fGameWindow)._M_t.
                      super___uniq_ptr_impl<FrobTadsWindow,_std::default_delete<FrobTadsWindow>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_FrobTadsWindow_*,_std::default_delete<FrobTadsWindow>_>
                      .super__Head_base<0UL,_FrobTadsWindow_*,_false>._M_head_impl,y + -1,x);
      FrobTadsWindow::printChar
                ((this->fGameWindow)._M_t.
                 super___uniq_ptr_impl<FrobTadsWindow,_std::default_delete<FrobTadsWindow>_>._M_t.
                 super__Tuple_impl<0UL,_FrobTadsWindow_*,_std::default_delete<FrobTadsWindow>_>.
                 super__Head_base<0UL,_FrobTadsWindow_*,_false>._M_head_impl,y,x,ch);
    }
  }
  for (; left <= right; left = left + 1) {
    FrobTadsWindow::printChar
              ((this->fGameWindow)._M_t.
               super___uniq_ptr_impl<FrobTadsWindow,_std::default_delete<FrobTadsWindow>_>._M_t.
               super__Tuple_impl<0UL,_FrobTadsWindow_*,_std::default_delete<FrobTadsWindow>_>.
               super__Head_base<0UL,_FrobTadsWindow_*,_false>._M_head_impl,top,left,attrs | 0x20);
  }
  if ((this->super_FrobTadsApplication).options.softScroll == false) {
    return;
  }
  FrobTadsWindow::flush
            ((this->fGameWindow)._M_t.
             super___uniq_ptr_impl<FrobTadsWindow,_std::default_delete<FrobTadsWindow>_>._M_t.
             super__Tuple_impl<0UL,_FrobTadsWindow_*,_std::default_delete<FrobTadsWindow>_>.
             super__Head_base<0UL,_FrobTadsWindow_*,_false>._M_head_impl);
  return;
}

Assistant:

void
FrobTadsApplicationCurses::scrollRegionUp( int top, int left, int bottom, int right, int attrs )
{
    // Old curses versions might break when using overlapping
    // windows, so we do the scrolling by hand.
    for (int y = bottom; y > top; --y) {
        for (int x = left; x <= right; ++x) {
            const chtype c = this->fGameWindow->charAt(y-1, x);
            this->fGameWindow->printChar(y, x, c);
        }
    }

    // Clear the last line.
    const chtype c = attrs | ' ';
    for (int i = left; i <= right; ++i) this->fGameWindow->printChar(top, i, c);

    // If soft-scrolling is enabled, update the display so that we
    // have a visible scrolling-effect.
    if (this->options.softScroll) this->fGameWindow->flush();
}